

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadEscape
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *startingLocation,
          EncodedCharPtr endOfSource,codepoint_t *outChar)

{
  EncodedCharPtr puVar1;
  code *pcVar2;
  byte *pbVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  byte bVar8;
  codepoint_t cVar9;
  uint uVar10;
  byte bVar11;
  int local_38;
  uint local_34;
  int hexValue;
  
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x10c,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar4) goto LAB_00f180e6;
    *puVar6 = 0;
  }
  if (endOfSource < *startingLocation) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x10d,"(startingLocation <= endOfSource)","startingLocation <= endOfSource")
    ;
    if (!bVar4) goto LAB_00f180e6;
    *puVar6 = 0;
  }
  puVar1 = *startingLocation;
  if (endOfSource <= puVar1) {
    return false;
  }
  if (*puVar1 != 'u') {
    return false;
  }
  pbVar7 = puVar1 + 1;
  cVar9 = 0;
  if ((pbVar7 < endOfSource) && (*pbVar7 == 0x7b)) {
    bVar8 = this->es6UnicodeMode;
    if ((bool)bVar8 != false) {
      pbVar7 = puVar1 + 2;
    }
  }
  else {
    bVar8 = 0;
  }
  local_38 = 0;
  bVar11 = true;
  if (pbVar7 < endOfSource) {
    local_34 = -(uint)bVar8 | 4;
    uVar10 = 0;
    cVar9 = 0;
    pbVar3 = pbVar7;
    while( true ) {
      pbVar7 = pbVar3 + 1;
      bVar11 = *pbVar3;
      BVar5 = Js::NumberUtilities::FHexDigit((ushort)bVar11,&local_38);
      if (BVar5 == 0) break;
      cVar9 = cVar9 * 0x10 + local_38;
      if (0x10ffff < cVar9) {
        return false;
      }
      uVar10 = uVar10 + 1;
      if ((local_34 <= uVar10) || (pbVar3 = pbVar7, endOfSource <= pbVar7)) break;
    }
    bVar11 = bVar11 != 0x7d;
  }
  else {
    uVar10 = 0;
  }
  if (uVar10 == 0) {
    return false;
  }
  if (uVar10 == 4) {
    if (bVar8 == 0) goto LAB_00f180c3;
  }
  else if (bVar8 == 0) {
    return false;
  }
  if (this->es6UnicodeMode == false) {
    local_34 = CONCAT31(local_34._1_3_,bVar11);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x13c,"(expectCurly ? es6UnicodeMode : true)",
                       "expectCurly ? es6UnicodeMode : true");
    if (!bVar4) {
LAB_00f180e6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    bVar11 = (byte)local_34;
  }
LAB_00f180c3:
  if ((bVar8 & bVar11) != 0) {
    return false;
  }
  *outChar = cVar9;
  *startingLocation = pbVar7;
  return true;
}

Assistant:

bool Scanner<EncodingPolicy>::TryReadEscape(EncodedCharPtr& startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar)
{
    Assert(outChar != nullptr);
    Assert(startingLocation <= endOfSource);

    EncodedCharPtr currentLocation = startingLocation;
    codepoint_t charToOutput = 0x0;

    // '\' is Assumed as there is only one caller
    // Read 'u' characters
    if (currentLocation >= endOfSource || this->ReadFirst(currentLocation, endOfSource) != 'u')
    {
        return false;
    }

    bool expectCurly = false;

    if (currentLocation < endOfSource && this->PeekFirst(currentLocation, endOfSource) == '{' && es6UnicodeMode)
    {
        expectCurly = true;
        // Move past the character
        this->ReadFirst(currentLocation, endOfSource);
    }

    uint i = 0;
    OLECHAR ch = 0;
    int hexValue = 0;
    uint maxHexDigits = (expectCurly ? MAXUINT32 : 4u);

    for(; i < maxHexDigits && currentLocation < endOfSource; i++)
    {
        if (!Js::NumberUtilities::FHexDigit(ch = this->ReadFirst(currentLocation, endOfSource), &hexValue))
        {
            break;
        }

        charToOutput = charToOutput * 0x10 + hexValue;

        if (charToOutput > 0x10FFFF)
        {
            return false;
        }
    }

    //At least 4 characters have to be read
    if (i == 0 || (i != 4 && !expectCurly))
    {
        return false;
    }

    Assert(expectCurly ? es6UnicodeMode : true);

    if (expectCurly && ch != '}')
    {
        return false;
    }

    *outChar = charToOutput;
    startingLocation = currentLocation;
    return true;
}